

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O0

int deserializeSignature2
              (signature2_t *sig,uint8_t *sigBytes,size_t sigBytesLen,picnic_instance_t *params)

{
  long lVar1;
  int iVar2;
  size_t sVar3;
  void *pvVar4;
  ulong __n;
  long in_RCX;
  ulong in_RDX;
  void *in_RSI;
  undefined8 *in_RDI;
  size_t msgsBitLength;
  size_t msgsByteLength;
  uint16_t P_t_1;
  size_t t_1;
  uint16_t P_t;
  size_t t;
  size_t seedInfoLen;
  uint16_t hideList [1];
  uint16_t *missingLeaves;
  size_t missingLeavesSize;
  size_t bytesRequired;
  picnic_instance_t *in_stack_000001c8;
  uint8_t *in_stack_000001d0;
  uint16_t *in_stack_000001d8;
  uint16_t *in_stack_000001e0;
  picnic_instance_t *in_stack_ffffffffffffff68;
  proof2_t *in_stack_ffffffffffffff70;
  picnic_instance_t *in_stack_ffffffffffffff88;
  undefined6 in_stack_ffffffffffffff90;
  undefined2 in_stack_ffffffffffffff96;
  size_t in_stack_ffffffffffffff98;
  undefined6 in_stack_ffffffffffffffa0;
  undefined2 in_stack_ffffffffffffffa6;
  size_t in_stack_ffffffffffffffa8;
  uint numNodes;
  ulong uVar5;
  undefined1 local_42 [2];
  uint16_t *local_40;
  long local_38;
  ulong local_30;
  long local_28;
  ulong local_20;
  undefined8 *local_18;
  undefined8 *local_10;
  int local_4;
  
  local_30 = (ulong)(int)(*(byte *)(in_RCX + 6) + 0x20);
  if (in_RDX < local_30) {
    local_4 = 1;
  }
  else {
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = (undefined8 *)in_RSI;
    local_10 = in_RDI;
    memcpy((void *)in_RDI[8],in_RSI,(ulong)*(byte *)(in_RCX + 6));
    local_18 = (undefined8 *)((long)local_18 + (long)(int)(uint)*(byte *)(local_28 + 6));
    *local_10 = *local_18;
    local_10[1] = local_18[1];
    local_10[2] = local_18[2];
    local_10[3] = local_18[3];
    local_18 = local_18 + 4;
    expandChallenge(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0,in_stack_000001c8);
    sVar3 = revealSeedsSize((uint)(in_stack_ffffffffffffffa8 >> 0x20),
                            (uint16_t *)
                            CONCAT26(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0),
                            in_stack_ffffffffffffff98,
                            (picnic_instance_t *)
                            CONCAT26(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90));
    local_10[5] = sVar3;
    if (local_10[5] == -1) {
      local_4 = 1;
    }
    else {
      local_30 = local_10[5] + local_30;
      local_38 = (long)(int)((uint)*(ushort *)(local_28 + 4) - (uint)*(byte *)(local_28 + 10));
      local_40 = getMissingLeavesList
                           ((uint16_t *)
                            CONCAT26(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90),
                            in_stack_ffffffffffffff88);
      sVar3 = openMerkleTreeSize(in_stack_ffffffffffffffa8,
                                 (uint16_t *)
                                 CONCAT26(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0),
                                 in_stack_ffffffffffffff98,
                                 (picnic_instance_t *)
                                 CONCAT26(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90));
      numNodes = (uint)(in_stack_ffffffffffffffa8 >> 0x20);
      local_10[7] = sVar3;
      local_30 = local_10[7] + local_30;
      free(local_40);
      if (local_10[7] == -1) {
        local_4 = 1;
      }
      else {
        memset(local_42,0,2);
        sVar3 = revealSeedsSize(numNodes,(uint16_t *)
                                         CONCAT26(in_stack_ffffffffffffffa6,
                                                  in_stack_ffffffffffffffa0),
                                in_stack_ffffffffffffff98,
                                (picnic_instance_t *)
                                CONCAT26(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90));
        if (sVar3 == 0xffffffffffffffff) {
          local_4 = 1;
        }
        else {
          for (uVar5 = 0; uVar5 < *(ushort *)(local_28 + 4); uVar5 = uVar5 + 1) {
            iVar2 = contains((uint16_t *)local_10[9],(ulong)*(byte *)(local_28 + 10),(uint16_t)uVar5
                            );
            if (iVar2 != 0) {
              lVar1 = local_10[10];
              iVar2 = indexOf((uint16_t *)local_10[9],(ulong)*(byte *)(local_28 + 10),
                              (uint16_t)uVar5);
              if ((uint)*(ushort *)(lVar1 + (long)iVar2 * 2) != *(byte *)(local_28 + 0xb) - 1) {
                local_30 = *(byte *)(local_28 + 9) + local_30;
              }
              local_30 = sVar3 + (ulong)*(byte *)(local_28 + 9) +
                                 (ulong)*(byte *)(local_28 + 8) + *(byte *)(local_28 + 6) + local_30
              ;
            }
          }
          if (local_20 == local_30) {
            pvVar4 = malloc(local_10[5]);
            local_10[4] = pvVar4;
            memcpy((void *)local_10[4],local_18,local_10[5]);
            local_18 = (undefined8 *)(local_10[5] + (long)local_18);
            pvVar4 = malloc(local_10[7]);
            local_10[6] = pvVar4;
            memcpy((void *)local_10[6],local_18,local_10[7]);
            local_18 = (undefined8 *)(local_10[7] + (long)local_18);
            for (uVar5 = 0; uVar5 < *(ushort *)(local_28 + 4); uVar5 = uVar5 + 1) {
              iVar2 = contains((uint16_t *)local_10[9],(ulong)*(byte *)(local_28 + 10),
                               (uint16_t)uVar5);
              if (iVar2 != 0) {
                allocateProof2(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
                *(size_t *)(local_10[0xb] + uVar5 * 0x38 + 8) = sVar3;
                pvVar4 = malloc(*(size_t *)(local_10[0xb] + uVar5 * 0x38 + 8));
                *(void **)(local_10[0xb] + uVar5 * 0x38) = pvVar4;
                memcpy(*(void **)(local_10[0xb] + uVar5 * 0x38),local_18,
                       *(size_t *)(local_10[0xb] + uVar5 * 0x38 + 8));
                local_18 = (undefined8 *)
                           (*(long *)(local_10[0xb] + uVar5 * 0x38 + 8) + (long)local_18);
                in_stack_ffffffffffffff70 = (proof2_t *)local_10[10];
                iVar2 = indexOf((uint16_t *)local_10[9],(ulong)*(byte *)(local_28 + 10),
                                (uint16_t)uVar5);
                if ((uint)*(ushort *)((long)&in_stack_ffffffffffffff70->seedInfo + (long)iVar2 * 2)
                    != *(byte *)(local_28 + 0xb) - 1) {
                  memcpy(*(void **)(local_10[0xb] + uVar5 * 0x38 + 0x10),local_18,
                         (ulong)*(byte *)(local_28 + 9));
                  local_18 = (undefined8 *)
                             ((long)local_18 + (long)(int)(uint)*(byte *)(local_28 + 9));
                  iVar2 = arePaddingBitsZero((uint8_t *)in_stack_ffffffffffffff70,
                                             (size_t)in_stack_ffffffffffffff68,0x145406);
                  if (iVar2 == 0) {
                    return -1;
                  }
                }
                memcpy(*(void **)(local_10[0xb] + uVar5 * 0x38 + 0x20),local_18,
                       (ulong)*(byte *)(local_28 + 8));
                iVar2 = arePaddingBitsZero((uint8_t *)in_stack_ffffffffffffff70,
                                           (size_t)in_stack_ffffffffffffff68,0x145481);
                if (iVar2 == 0) {
                  return -1;
                }
                local_18 = (undefined8 *)((long)local_18 + (long)(int)(uint)*(byte *)(local_28 + 8))
                ;
                __n = (ulong)*(byte *)(local_28 + 9);
                memcpy(*(void **)(local_10[0xb] + uVar5 * 0x38 + 0x28),local_18,__n);
                local_18 = (undefined8 *)(__n + (long)local_18);
                iVar2 = arePaddingBitsZero((uint8_t *)in_stack_ffffffffffffff70,
                                           (size_t)in_stack_ffffffffffffff68,0x14554a);
                if (iVar2 == 0) {
                  return -1;
                }
                memcpy(*(void **)(local_10[0xb] + uVar5 * 0x38 + 0x18),local_18,
                       (ulong)*(byte *)(local_28 + 6));
                local_18 = (undefined8 *)((long)local_18 + (long)(int)(uint)*(byte *)(local_28 + 6))
                ;
              }
            }
            local_4 = 0;
          }
          else {
            local_4 = 1;
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

static int deserializeSignature2(signature2_t* sig, const uint8_t* sigBytes, size_t sigBytesLen,
                                 const picnic_instance_t* params) {
  /* Read the challenge and salt */
  size_t bytesRequired = params->digest_size + SALT_SIZE;

  if (sigBytesLen < bytesRequired) {
    return EXIT_FAILURE;
  }

  memcpy(sig->challenge, sigBytes, params->digest_size);
  sigBytes += params->digest_size;
  memcpy(sig->salt, sigBytes, SALT_SIZE);
  sigBytes += SALT_SIZE;

  expandChallenge(sig->challengeC, sig->challengeP, sig->challenge, params);

  /* Add size of iSeeds tree data */
  sig->iSeedInfoLen =
      revealSeedsSize(params->num_rounds, sig->challengeC, params->num_opened_rounds, params);
  if (sig->iSeedInfoLen == SIZE_MAX) {
    return EXIT_FAILURE;
  }
  bytesRequired += sig->iSeedInfoLen;

  /* Add the size of the Cv Merkle tree data */
  size_t missingLeavesSize = params->num_rounds - params->num_opened_rounds;
  uint16_t* missingLeaves  = getMissingLeavesList(sig->challengeC, params);
  sig->cvInfoLen = openMerkleTreeSize(params->num_rounds, missingLeaves, missingLeavesSize, params);
  bytesRequired += sig->cvInfoLen;
  free(missingLeaves);
  if (sig->cvInfoLen == SIZE_MAX) {
    return EXIT_FAILURE;
  }

  /* Compute the number of bytes required for the proofs */
  uint16_t hideList[1] = {0};
  size_t seedInfoLen   = revealSeedsSize(params->num_MPC_parties, hideList, 1, params);
  if (seedInfoLen == SIZE_MAX) {
    return EXIT_FAILURE;
  }

  for (size_t t = 0; t < params->num_rounds; t++) {
    if (contains(sig->challengeC, params->num_opened_rounds, t)) {
      uint16_t P_t = sig->challengeP[indexOf(sig->challengeC, params->num_opened_rounds, t)];
      if (P_t != (params->num_MPC_parties - 1u)) {
        bytesRequired += params->view_size;
      }
      bytesRequired += params->digest_size;
      bytesRequired += params->input_output_size;
      bytesRequired += params->view_size;
      bytesRequired += seedInfoLen;
    }
  }

  /* Fail if the signature does not have the exact number of bytes we expect */
  if (sigBytesLen != bytesRequired) {
#if !defined(NDEBUG)
    printf("%s: sigBytesLen = " SIZET_FMT ", expected bytesRequired = " SIZET_FMT "\n", __func__,
           sigBytesLen, bytesRequired);
#endif
    return EXIT_FAILURE;
  }

  sig->iSeedInfo = malloc(sig->iSeedInfoLen);
  memcpy(sig->iSeedInfo, sigBytes, sig->iSeedInfoLen);
  sigBytes += sig->iSeedInfoLen;

  sig->cvInfo = malloc(sig->cvInfoLen);
  memcpy(sig->cvInfo, sigBytes, sig->cvInfoLen);
  sigBytes += sig->cvInfoLen;

  /* Read the proofs */
  for (size_t t = 0; t < params->num_rounds; t++) {
    if (contains(sig->challengeC, params->num_opened_rounds, t)) {
      allocateProof2(&sig->proofs[t], params);
      sig->proofs[t].seedInfoLen = seedInfoLen;
      sig->proofs[t].seedInfo    = malloc(sig->proofs[t].seedInfoLen);
      memcpy(sig->proofs[t].seedInfo, sigBytes, sig->proofs[t].seedInfoLen);
      sigBytes += sig->proofs[t].seedInfoLen;

      uint16_t P_t = sig->challengeP[indexOf(sig->challengeC, params->num_opened_rounds, t)];
      if (P_t != (params->num_MPC_parties - 1u)) {
        memcpy(sig->proofs[t].aux, sigBytes, params->view_size);
        sigBytes += params->view_size;
        if (!arePaddingBitsZero(sig->proofs[t].aux, params->view_size,
                                3 * params->lowmc.r * params->lowmc.m)) {
#if !defined(NDEBUG)
          printf("%s: failed while deserializing aux bits\n", __func__);
#endif
          return -1;
        }
      }

      memcpy(sig->proofs[t].input, sigBytes, params->input_output_size);
      if (!arePaddingBitsZero(sig->proofs[t].input, params->input_output_size, params->lowmc.n)) {
#if !defined(NDEBUG)
        printf("%s: failed while deserializing input bits\n", __func__);
#endif
        return -1;
      }
      sigBytes += params->input_output_size;

      size_t msgsByteLength = params->view_size;
      memcpy(sig->proofs[t].msgs, sigBytes, msgsByteLength);
      sigBytes += msgsByteLength;
      size_t msgsBitLength = 3 * params->lowmc.r * params->lowmc.m;
      if (!arePaddingBitsZero(sig->proofs[t].msgs, msgsByteLength, msgsBitLength)) {
#if !defined(NDEBUG)
        printf("%s: failed while deserializing msgs bits\n", __func__);
#endif
        return -1;
      }

      memcpy(sig->proofs[t].C, sigBytes, params->digest_size);
      sigBytes += params->digest_size;
    }
  }

  return EXIT_SUCCESS;
}